

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.c
# Opt level: O3

int getregion(region *rp)

{
  line *plVar1;
  line *plVar2;
  line *plVar3;
  line *plVar4;
  mgwin *pmVar5;
  int iVar6;
  line *plVar7;
  int iVar8;
  char *fmt;
  line *plVar9;
  line *plVar10;
  
  plVar1 = curwp->w_markp;
  if (plVar1 == (line *)0x0) {
    dobeep();
    fmt = "No mark set in this window";
LAB_001160e6:
    iVar6 = 0;
    ewprintf(fmt);
  }
  else {
    plVar2 = curwp->w_dotp;
    if (plVar2 == plVar1) {
      rp->r_linep = plVar2;
      pmVar5 = curwp;
      rp->r_lineno = curwp->w_dotline;
      iVar6 = pmVar5->w_doto;
      iVar8 = pmVar5->w_marko;
      if (iVar6 < iVar8) {
        rp->r_offset = iVar6;
        rp->r_size = iVar8 - iVar6;
      }
      else {
        rp->r_offset = iVar8;
        rp->r_size = iVar6 - iVar8;
      }
    }
    else {
      iVar6 = curwp->w_doto;
      iVar8 = (plVar2->l_used - iVar6) + 1;
      plVar3 = curbp->b_headp;
      plVar9 = plVar2;
      plVar10 = plVar2;
      do {
        do {
          plVar4 = plVar10->l_fp;
          if (plVar4 == plVar3) {
            plVar7 = plVar9->l_bp;
            if (plVar7 == plVar3) {
              dobeep();
              fmt = "Bug: lost mark";
              goto LAB_001160e6;
            }
          }
          else {
            if (plVar4 == plVar1) {
              rp->r_linep = plVar2;
              pmVar5 = curwp;
              rp->r_offset = curwp->w_doto;
              rp->r_lineno = pmVar5->w_dotline;
              rp->r_size = iVar8 + pmVar5->w_marko;
              goto LAB_001160f7;
            }
            iVar8 = iVar8 + plVar4->l_used + 1;
            plVar7 = plVar9->l_bp;
            plVar10 = plVar4;
          }
        } while (plVar7 == plVar3);
        iVar6 = iVar6 + plVar7->l_used + 1;
        plVar9 = plVar7;
      } while (plVar7 != plVar1);
      rp->r_linep = plVar7;
      pmVar5 = curwp;
      iVar8 = curwp->w_marko;
      rp->r_offset = iVar8;
      rp->r_lineno = pmVar5->w_markline;
      rp->r_size = iVar6 - iVar8;
    }
LAB_001160f7:
    iVar6 = 1;
  }
  return iVar6;
}

Assistant:

static int
getregion(struct region *rp)
{
	struct line	*flp, *blp;
	long	 fsize, bsize;

	if (curwp->w_markp == NULL) {
		dobeep();
		ewprintf("No mark set in this window");
		return (FALSE);
	}

	/* "r_size" always ok */
	if (curwp->w_dotp == curwp->w_markp) {
		rp->r_linep = curwp->w_dotp;
		rp->r_lineno = curwp->w_dotline;
		if (curwp->w_doto < curwp->w_marko) {
			rp->r_offset = curwp->w_doto;
			rp->r_size = (RSIZE)(curwp->w_marko - curwp->w_doto);
		} else {
			rp->r_offset = curwp->w_marko;
			rp->r_size = (RSIZE)(curwp->w_doto - curwp->w_marko);
		}
		return (TRUE);
	}
	/* get region size */
	flp = blp = curwp->w_dotp;
	bsize = curwp->w_doto;
	fsize = llength(flp) - curwp->w_doto + 1;
	while (lforw(flp) != curbp->b_headp || lback(blp) != curbp->b_headp) {
		if (lforw(flp) != curbp->b_headp) {
			flp = lforw(flp);
			if (flp == curwp->w_markp) {
				rp->r_linep = curwp->w_dotp;
				rp->r_offset = curwp->w_doto;
				rp->r_lineno = curwp->w_dotline;
				return (setsize(rp,
				    (RSIZE)(fsize + curwp->w_marko)));
			}
			fsize += llength(flp) + 1;
		}
		if (lback(blp) != curbp->b_headp) {
			blp = lback(blp);
			bsize += llength(blp) + 1;
			if (blp == curwp->w_markp) {
				rp->r_linep = blp;
				rp->r_offset = curwp->w_marko;
				rp->r_lineno = curwp->w_markline;
				return (setsize(rp,
				    (RSIZE)(bsize - curwp->w_marko)));
			}
		}
	}
	dobeep();
	ewprintf("Bug: lost mark");
	return (FALSE);
}